

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.c
# Opt level: O0

int X509_REVOKED_set_revocationDate(X509_REVOKED *r,ASN1_TIME *tm)

{
  ASN1_TIME *in;
  ASN1_STRING *local_20;
  uint local_4;
  
  if (r == (X509_REVOKED *)0x0) {
    local_4 = 0;
  }
  else {
    local_20 = (ASN1_STRING *)r->issuer;
    if ((local_20 != tm) && (local_20 = ASN1_STRING_dup(tm), local_20 != (ASN1_STRING *)0x0)) {
      ASN1_TIME_free((ASN1_TIME *)r->issuer);
      r->issuer = (stack_st_GENERAL_NAME *)local_20;
    }
    local_4 = (uint)(local_20 != (ASN1_STRING *)0x0);
  }
  return local_4;
}

Assistant:

int X509_REVOKED_set_revocationDate(X509_REVOKED *x, ASN1_TIME *tm)
{
    ASN1_TIME *in;

    if (x == NULL)
        return 0;
    in = x->revocationDate;
    if (in != tm) {
        in = ASN1_STRING_dup(tm);
        if (in != NULL) {
            ASN1_TIME_free(x->revocationDate);
            x->revocationDate = in;
        }
    }
    return (in != NULL);
}